

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regeximp.cpp
# Opt level: O1

UChar32 __thiscall icu_63::CaseFoldingUCharIterator::next(CaseFoldingUCharIterator *this)

{
  UChar UVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  
  if (this->fFoldChars == (UChar *)0x0) {
    lVar3 = this->fIndex;
    if (this->fLimit <= lVar3) {
      return -1;
    }
    this->fIndex = lVar3 + 1;
    UVar1 = this->fChars[lVar3];
    uVar4 = (uint)(ushort)UVar1;
    if ((lVar3 + 1 != this->fLimit && (UVar1 & 0xfc00U) == 0xd800) &&
       (uVar5 = (uint)(ushort)this->fChars[lVar3 + 1], (uVar5 & 0xfc00) == 0xdc00)) {
      this->fIndex = lVar3 + 2;
      uVar4 = (uint)(ushort)UVar1 * 0x400 + uVar5 + 0xfca02400;
    }
    uVar4 = ucase_toFullFolding_63(uVar4,&this->fFoldChars,0);
    this->fFoldLength = uVar4;
    if (0x1e < uVar4) {
      if ((int)uVar4 < 0) {
        this->fFoldLength = ~uVar4;
      }
      uVar4 = this->fFoldLength;
      goto LAB_0026f211;
    }
    this->fFoldIndex = 0;
  }
  iVar2 = this->fFoldIndex;
  this->fFoldIndex = iVar2 + 1;
  UVar1 = this->fFoldChars[iVar2];
  uVar4 = (uint)(ushort)UVar1;
  if ((((UVar1 & 0xfc00U) == 0xd800) && (iVar2 + 1 != this->fFoldLength)) &&
     (uVar5 = (uint)(ushort)this->fFoldChars[(long)iVar2 + 1], (uVar5 & 0xfc00) == 0xdc00)) {
    this->fFoldIndex = iVar2 + 2;
    uVar4 = (uint)(ushort)UVar1 * 0x400 + uVar5 + 0xfca02400;
  }
  if (this->fFoldIndex < this->fFoldLength) {
    return uVar4;
  }
LAB_0026f211:
  this->fFoldChars = (UChar *)0x0;
  return uVar4;
}

Assistant:

UChar32 CaseFoldingUCharIterator::next() {
    UChar32  foldedC;
    UChar32  originalC;
    if (fFoldChars == NULL) {
        // We are not in a string folding of an earlier character.
        // Start handling the next char from the input UText.
        if (fIndex >= fLimit) {
            return U_SENTINEL;
        }
        U16_NEXT(fChars, fIndex, fLimit, originalC);

        fFoldLength = ucase_toFullFolding(originalC, &fFoldChars, U_FOLD_CASE_DEFAULT);
        if (fFoldLength >= UCASE_MAX_STRING_LENGTH || fFoldLength < 0) {
            // input code point folds to a single code point, possibly itself.
            // See comment in ucase.h for explanation of return values from ucase_toFullFoldings.
            if (fFoldLength < 0) {
                fFoldLength = ~fFoldLength;
            }
            foldedC = (UChar32)fFoldLength;
            fFoldChars = NULL;
            return foldedC;
        }
        // String foldings fall through here.
        fFoldIndex = 0;
    }

    U16_NEXT(fFoldChars, fFoldIndex, fFoldLength, foldedC);
    if (fFoldIndex >= fFoldLength) {
        fFoldChars = NULL;
    }
    return foldedC;
}